

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall CVmObjDate::CVmObjDate(CVmObjDate *this,int32_t dayno,uint32_t daytime)

{
  vm_date_ext *pvVar1;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0035d4e0;
  pvVar1 = vm_date_ext::alloc_ext(this);
  (this->super_CVmObject).ext_ = (char *)pvVar1;
  pvVar1->dayno = dayno;
  pvVar1->daytime = daytime;
  return;
}

Assistant:

CVmObjDate::CVmObjDate(VMG_ int32_t dayno, uint32_t daytime)
{
    /* allocate our extension structure */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* fill it in */
    ext->dayno = dayno;
    ext->daytime = daytime;
}